

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_FLTK.cxx
# Opt level: O3

void __thiscall Fl_FLTK_File_Chooser::parse_filter(Fl_FLTK_File_Chooser *this)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  byte bVar6;
  byte *__s;
  char cVar7;
  char wildcard [1024];
  char name [1024];
  char comp [2048];
  char local_1038 [1024];
  char local_c38 [1024];
  byte local_838 [2056];
  
  if (this->_parsedfilt != (char *)0x0) {
    operator_delete__(this->_parsedfilt);
  }
  this->_parsedfilt = (char *)0x0;
  this->_nfilters = 0;
  __s = (byte *)this->_filter;
  if (__s == (byte *)0x0) {
    return;
  }
  pcVar2 = strchr((char *)__s,9);
  cVar7 = (pcVar2 == (char *)0x0) * '\t' + 'n';
  memset(local_1038,0,0x400);
  memset(local_c38,0,0x400);
  pcVar2 = (char *)0x0;
  do {
    bVar6 = *__s;
    if (bVar6 < 10) {
      if (bVar6 == 0) goto LAB_001c2ce8;
      if ((bVar6 != 9) || (cVar1 = 'w', cVar7 != 'n')) goto LAB_001c2ca8;
    }
    else if ((bVar6 == 10) || (bVar6 == 0xd)) {
LAB_001c2ce8:
      if (local_1038[0] != '\0') {
        pcVar5 = "\t";
        if (pcVar2 == (char *)0x0) {
          pcVar5 = "";
        }
        sprintf((char *)local_838,"%s%.511s(%.511s)",pcVar5,local_c38,local_1038);
        pcVar5 = this->_parsedfilt;
        if (pcVar5 == (char *)0x0) {
          pcVar2 = strnew((char *)local_838);
        }
        else {
          sVar3 = strlen(pcVar5);
          sVar4 = strlen((char *)local_838);
          pcVar2 = (char *)operator_new__(sVar4 + sVar3 + 1);
          strcpy(pcVar2,pcVar5);
          strcat(pcVar2,(char *)local_838);
          operator_delete__(pcVar5);
        }
        this->_parsedfilt = pcVar2;
        this->_nfilters = this->_nfilters + 1;
        bVar6 = *__s;
      }
      local_c38[0] = '\0';
      local_1038[0] = '\0';
      pcVar5 = strchr((char *)__s,9);
      if (bVar6 == 0) {
        return;
      }
      cVar1 = (pcVar5 == (char *)0x0) * '\t' + 'n';
    }
    else {
      if (bVar6 == 0x5c) {
        __s = __s + 1;
      }
LAB_001c2ca8:
      if (cVar7 == 'w') {
        local_838[0] = *__s;
        local_838[1] = 0;
        strcat(local_1038,(char *)local_838);
        cVar1 = 'w';
      }
      else {
        cVar1 = cVar7;
        if (cVar7 == 'n') {
          local_838[0] = *__s;
          local_838[1] = 0;
          strcat(local_c38,(char *)local_838);
          cVar1 = 'n';
        }
      }
    }
    cVar7 = cVar1;
    __s = __s + 1;
  } while( true );
}

Assistant:

void Fl_FLTK_File_Chooser::parse_filter() {
  _parsedfilt = strfree(_parsedfilt);	// clear previous parsed filter (if any)
  _nfilters = 0;
  char *in = _filter;
  if ( !in ) return;

  int has_name = strchr(in, '\t') ? 1 : 0;

  char mode = has_name ? 'n' : 'w';	// parse mode: n=title, w=wildcard
  char wildcard[1024] = "";		// parsed wildcard
  char name[1024] = "";

  // Parse filter user specified
  for ( ; 1; in++ ) {
    /*** DEBUG
    printf("WORKING ON '%c': mode=<%c> name=<%s> wildcard=<%s>\n",
			*in, mode,     name,     wildcard);
    ***/

    switch (*in) {
      // FINISHED PARSING NAME?
      case '\t':
        if ( mode != 'n' ) goto regchar;
        mode = 'w';
        break; 
      // ESCAPE NEXT CHAR
      case '\\':
	++in;
	goto regchar; 
      // FINISHED PARSING ONE OF POSSIBLY SEVERAL FILTERS?
      case '\r':
      case '\n':
      case '\0':
	// APPEND NEW FILTER TO LIST
	if ( wildcard[0] ) {
	  // OUT: "name(wild)\tname(wild)"
	  char comp[2048];
	  sprintf(comp, "%s%.511s(%.511s)", ((_parsedfilt)?"\t":""),
					    name, wildcard);
	  _parsedfilt = strapp(_parsedfilt, comp);
	  _nfilters++;
	  //DEBUG printf("DEBUG: PARSED FILT NOW <%s>\n", _parsedfilt);
	}
	// RESET
	wildcard[0] = name[0] = '\0';
	mode = strchr(in, '\t') ? 'n' : 'w';
	// DONE?
	if ( *in == '\0' ) return;	// done
	else continue;			// not done yet, more filters

      // Parse all other chars
      default:				// handle all non-special chars
      regchar:				// handle regular char
	switch ( mode ) {
	  case 'n': chrcat(name, *in);     continue;
	  case 'w': chrcat(wildcard, *in); continue;
	}
	break;
    }
  }
  //NOTREACHED
}